

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.h
# Opt level: O1

R_conflict10 __thiscall
QtPrivate::
q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
::operator()(q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
             *this,char *first,char *last,char *pat_first,char *pat_last)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  byte *pbVar5;
  char *pcVar6;
  ulong uVar7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  R_conflict10 RVar13;
  
  uVar10 = (long)pat_last - (long)pat_first;
  pbVar5 = (byte *)first;
  pbVar9 = (byte *)first;
  if (uVar10 != 0) {
    pbVar11 = (byte *)(first + (uVar10 - 1));
    pbVar8 = (byte *)first;
    do {
      pbVar5 = (byte *)last;
      pbVar9 = (byte *)last;
      if (last <= pbVar11) break;
      uVar7 = (ulong)(byte)this[""[*pbVar11]];
      if (uVar7 == 0) {
        if ((long)uVar10 < 1) {
          uVar12 = 0;
        }
        else {
          if (""[*pbVar11] == pat_first[uVar10 - 1]) {
            pcVar6 = (char *)0x0;
            do {
              uVar12 = uVar10;
              if (pat_first + (1 - (long)pat_last) == pcVar6) goto LAB_00177ba4;
              pcVar4 = pcVar6 + -1;
              pcVar1 = pcVar6 + -1;
              pcVar3 = pcVar6 + -2;
              pcVar6 = pcVar1;
            } while (""[pbVar11[(long)pcVar4]] == pat_last[(long)pcVar3]);
            uVar12 = -(long)pcVar1;
            bVar2 = (long)uVar12 < (long)uVar10;
          }
          else {
            uVar12 = 0;
            bVar2 = 0 < (long)uVar10;
          }
          if (bVar2) {
            uVar7 = uVar10 - uVar12;
            if (uVar10 != (byte)this[""[pbVar11[-uVar12]]]) {
              uVar7 = 1;
            }
            goto LAB_00177b1b;
          }
        }
LAB_00177ba4:
        pbVar8 = pbVar11 + (uVar10 - uVar12) + 1;
        first = (char *)(pbVar11 + (1 - uVar12));
        bVar2 = false;
      }
      else {
LAB_00177b1b:
        pbVar11 = pbVar11 + uVar7;
        bVar2 = true;
      }
      pbVar5 = (byte *)first;
      pbVar9 = pbVar8;
    } while (bVar2);
  }
  RVar13.end = (char *)pbVar9;
  RVar13.begin = (char *)pbVar5;
  return RVar13;
}

Assistant:

constexpr auto operator()(RandomIt2 first, RandomIt2 last, RandomIt1 pat_first,
                              RandomIt1 pat_last) const
    {
        struct R
        {
            RandomIt2 begin, end;
        };
        Hash hf;
        BinaryPredicate pred;
        auto pat_length = std::distance(pat_first, pat_last);
        if (pat_length == 0)
            return R{ first, first };

        const qsizetype pl_minus_one = qsizetype(pat_length - 1);
        RandomIt2 current = first + pl_minus_one;

        while (current < last) {
            qsizetype skip = m_skiptable[hf(*current)];
            if (!skip) {
                // possible match
                while (skip < pat_length) {
                    if (!pred(hf(*(current - skip)), uchar(pat_first[pl_minus_one - skip])))
                        break;
                    skip++;
                }
                if (skip > pl_minus_one) { // we have a match
                    auto match = current - skip + 1;
                    return R{ match, match + pat_length };
                }

                // If we don't have a match we are a bit inefficient as we only skip by one
                // when we have the non matching char in the string.
                if (m_skiptable[hf(*(current - skip))] == pat_length)
                    skip = pat_length - skip;
                else
                    skip = 1;
            }
            current += skip;
        }

        return R{ last, last };
    }